

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O0

void ptrlist_split_node(ptr_list *head)

{
  undefined2 uVar1;
  allocator *A;
  ptr_list *ppVar2;
  int iVar3;
  int iVar4;
  ptr_list *ppVar5;
  ptr_list *next;
  ptr_list *newlist;
  allocator *alloc;
  int nr;
  int old;
  ptr_list *head_local;
  
  uVar1 = *(undefined2 *)head;
  iVar3 = (int)(short)(char)uVar1 / 2;
  A = head->allocator_;
  if (A != (allocator *)0x0) {
    ppVar5 = (ptr_list *)dmrC_allocator_allocate(A,0);
    ppVar2 = head->next_;
    ppVar5->allocator_ = A;
    iVar4 = (short)(char)uVar1 - iVar3;
    *(ushort *)head = *(ushort *)head & 0xff00 | (ushort)iVar4 & 0xff;
    ppVar5->next_ = ppVar2;
    ppVar2->prev_ = ppVar5;
    ppVar5->prev_ = head;
    head->next_ = ppVar5;
    *(ushort *)ppVar5 = *(ushort *)ppVar5 & 0xff00 | (ushort)iVar3 & 0xff;
    memcpy(ppVar5->list_,head->list_ + iVar4,(long)iVar3 << 3);
    memset(head->list_ + iVar4,0xf0,(long)iVar3 << 3);
    return;
  }
  __assert_fail("alloc",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/ptrlist.c"
                ,0x1d,"void ptrlist_split_node(struct ptr_list *)");
}

Assistant:

void ptrlist_split_node(struct ptr_list *head)
{
	int old = head->nr_, nr = old / 2;
	struct allocator *alloc = head->allocator_;
	assert(alloc);
	struct ptr_list *newlist =
	    (struct ptr_list *)dmrC_allocator_allocate(alloc, 0);
	struct ptr_list *next = head->next_;
	newlist->allocator_ = alloc;

	old -= nr;
	head->nr_ = old;
	newlist->next_ = next;
	next->prev_ = newlist;
	newlist->prev_ = head;
	head->next_ = newlist;
	newlist->nr_ = nr;
	memcpy(newlist->list_, head->list_ + old, nr * sizeof(void *));
	memset(head->list_ + old, 0xf0, nr * sizeof(void *));
}